

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O2

shared_ptr<chrono::ChLinkMotorRotationAngle> __thiscall
chrono::curiosity::AddMotorAngle
          (curiosity *this,shared_ptr<chrono::ChBody> *body1,shared_ptr<chrono::ChBody> *body2,
          shared_ptr<chrono::curiosity::CuriosityChassis> *chassis,ChVector<double> *rel_pos,
          ChQuaternion<double> *rel_rot)

{
  long *plVar1;
  _func_int *p_Var2;
  ChFrameMoving<double> *Fa;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chrono::ChLinkMotorRotationAngle> sVar3;
  ChFrame<double> X_GC;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_208 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_200;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_1f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  __shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2> local_1e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_1d8;
  ChFrame<double> local_1c8;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1d8,
             &(((chassis->
                super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr)->super_CuriosityPart).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  Fa = (ChFrameMoving<double> *)(**(code **)(*(long *)local_1d8._M_ptr + 0x1f0))();
  ChFrame<double>::ChFrame(&local_1c8,rel_pos,rel_rot);
  operator*(&local_b8,Fa,&local_1c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d8._M_refcount);
  std::make_shared<chrono::ChLinkMotorRotationAngle>();
  plVar1 = *(long **)this;
  std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_1f8,&body1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_208,&body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  ChFrame<double>::ChFrame(&local_140,&local_b8);
  (**(code **)(*plVar1 + 0x240))(plVar1,local_1f8,local_208,&local_140);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_200);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f0);
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)&local_1c8,
             &(((chassis->
                super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr)->super_CuriosityPart).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  p_Var2 = local_1c8._vptr_ChFrame[7];
  std::__shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChLinkMotorRotationAngle,void>
            (local_1e8,
             (__shared_ptr<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2> *)this);
  (**(code **)(*(long *)p_Var2 + 0x138))(p_Var2,local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1c8.coord);
  sVar3.super___shared_ptr<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChLinkMotorRotationAngle>)
         sVar3.super___shared_ptr<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChLinkMotorRotationAngle> AddMotorAngle(std::shared_ptr<ChBody> body1,
                                                        std::shared_ptr<ChBody> body2,
                                                        std::shared_ptr<CuriosityChassis> chassis,
                                                        const ChVector<>& rel_pos,
                                                        const ChQuaternion<>& rel_rot) {
    // Express relative frame in global
    ChFrame<> X_GC = chassis->GetBody()->GetFrame_REF_to_abs() * ChFrame<>(rel_pos, rel_rot);

    // Create motor (actuated DOF about Z axis of X_GC frame)
    auto motor = chrono_types::make_shared<ChLinkMotorRotationAngle>();
    motor->Initialize(body1, body2, X_GC);
    chassis->GetBody()->GetSystem()->AddLink(motor);

    return motor;
}